

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes_enums.h
# Opt level: O0

char * MLFeatureTypeType_Name(MLFeatureTypeType x)

{
  char *pcStack_10;
  MLFeatureTypeType x_local;
  
  switch(x) {
  case MLFeatureTypeType_NOT_SET:
    pcStack_10 = "INVALID";
    break;
  case MLFeatureTypeType_int64Type:
    pcStack_10 = "MLFeatureTypeType_int64Type";
    break;
  case MLFeatureTypeType_doubleType:
    pcStack_10 = "MLFeatureTypeType_doubleType";
    break;
  case MLFeatureTypeType_stringType:
    pcStack_10 = "MLFeatureTypeType_stringType";
    break;
  case MLFeatureTypeType_imageType:
    pcStack_10 = "MLFeatureTypeType_imageType";
    break;
  case MLFeatureTypeType_multiArrayType:
    pcStack_10 = "MLFeatureTypeType_multiArrayType";
    break;
  case MLFeatureTypeType_dictionaryType:
    pcStack_10 = "MLFeatureTypeType_dictionaryType";
    break;
  case MLFeatureTypeType_sequenceType:
    pcStack_10 = "MLFeatureTypeType_sequenceType";
    break;
  case MLFeatureTypeType_stateType:
    pcStack_10 = "MLFeatureTypeType_stateType";
    break;
  default:
    pcStack_10 = "INVALID";
  }
  return pcStack_10;
}

Assistant:

__attribute__((__unused__))
static const char * MLFeatureTypeType_Name(MLFeatureTypeType x) {
    switch (x) {
        case MLFeatureTypeType_int64Type:
            return "MLFeatureTypeType_int64Type";
        case MLFeatureTypeType_doubleType:
            return "MLFeatureTypeType_doubleType";
        case MLFeatureTypeType_stringType:
            return "MLFeatureTypeType_stringType";
        case MLFeatureTypeType_imageType:
            return "MLFeatureTypeType_imageType";
        case MLFeatureTypeType_multiArrayType:
            return "MLFeatureTypeType_multiArrayType";
        case MLFeatureTypeType_dictionaryType:
            return "MLFeatureTypeType_dictionaryType";
        case MLFeatureTypeType_sequenceType:
            return "MLFeatureTypeType_sequenceType";
        case MLFeatureTypeType_stateType:
            return "MLFeatureTypeType_stateType";
        case MLFeatureTypeType_NOT_SET:
            return "INVALID";
    }
    return "INVALID";
}